

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O1

void __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::SetIsPrototype
          (DictionaryTypeHandlerBase<unsigned_short> *this,DynamicObject *instance)

{
  Type *addr;
  DynamicType *oldType;
  PropertyRecord *propertyRecord;
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  RecyclerWeakReference<Js::DynamicObject> *pRVar6;
  PropertyRecord **ppPVar7;
  DictionaryPropertyDescriptor<unsigned_short> *descriptor;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  int index;
  anon_class_8_1_0902ba13 local_50;
  anon_class_8_1_0902ba13 setFixedFlags;
  
  if ((DAT_015d6346 == '\0') &&
     ((((this->super_DynamicTypeHandler).flags & 0x18) == 0 || (DAT_015d6345 == '\0')))) {
    DynamicTypeHandler::SetFlags(&this->super_DynamicTypeHandler,' ');
    return;
  }
  if (((this->super_DynamicTypeHandler).flags & 0x18) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x93b,"(!GetIsOrMayBecomeShared())","!GetIsOrMayBecomeShared()");
    if (!bVar2) goto LAB_00daa21e;
    *puVar5 = 0;
  }
  if ((((this->super_DynamicTypeHandler).flags & 0x10) != 0) &&
     ((this->singletonInstance).ptr != (RecyclerWeakReference<Js::DynamicObject> *)0x0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x93e,"(!GetIsShared() || this->singletonInstance == nullptr)",
                                "!GetIsShared() || this->singletonInstance == nullptr");
    if (!bVar2) goto LAB_00daa21e;
    *puVar5 = 0;
  }
  pRVar6 = (this->singletonInstance).ptr;
  if ((pRVar6 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) &&
     ((DynamicObject *)(pRVar6->super_RecyclerWeakReferenceBase).strongRef != instance)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x93f,
                                "(this->singletonInstance == nullptr || this->singletonInstance->Get() == instance)"
                                ,
                                "this->singletonInstance == nullptr || this->singletonInstance->Get() == instance"
                               );
    if (!bVar2) goto LAB_00daa21e;
    *puVar5 = 0;
  }
  oldType = (DynamicType *)(instance->super_RecyclableObject).type.ptr;
  local_50.instance = instance;
  setFixedFlags.instance = (DynamicObject *)GetSingletonInstance(this);
  TraceFixedFieldsBeforeSetIsProto
            (instance,&this->super_DynamicTypeHandler,oldType,
             (RecyclerWeakReference<Js::DynamicObject> *)setFixedFlags.instance);
  bVar2 = (bool)DAT_015d6346;
  if ((bool)DAT_015d6346 == true) {
    DynamicObject::ChangeType(instance);
    bVar3 = DynamicObject::HasSharedType(instance);
    if (bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0x97e,"(!instance->HasSharedType())","!instance->HasSharedType()"
                                 );
      if (!bVar3) goto LAB_00daa21e;
      *puVar5 = 0;
    }
  }
  bVar3 = ThreadContext::IsOnStack(instance);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x983,"(!ThreadContext::IsOnStack(instance))",
                                "!ThreadContext::IsOnStack(instance)");
    if (!bVar3) {
LAB_00daa21e:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  bVar3 = DynamicTypeHandler::ShouldFixAnyProperties();
  if ((bVar3) &&
     (addr = &this->singletonInstance, addr->ptr == (RecyclerWeakReference<Js::DynamicObject> *)0x0)
     ) {
    pRVar6 = DynamicObject::CreateWeakReferenceToSelf(instance);
    Memory::Recycler::WBSetBit((char *)addr);
    addr->ptr = pRVar6;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  }
  BVar4 = RecyclableObject::IsExternal(&instance->super_RecyclableObject);
  if ((BVar4 == 0) && (this_00 = (this->propertyMap).ptr, 0 < this_00->count - this_00->freeCount))
  {
    index = 0;
    do {
      ppPVar7 = JsUtil::
                BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::GetKeyAt(this_00,index);
      propertyRecord = *ppPVar7;
      descriptor = JsUtil::
                   BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                   ::GetReferenceAt((this->propertyMap).ptr,index);
      SetIsPrototype::anon_class_8_1_0902ba13::operator()(&local_50,propertyRecord,descriptor,bVar2)
      ;
      index = index + 1;
      this_00 = (this->propertyMap).ptr;
    } while (index < this_00->count - this_00->freeCount);
  }
  DynamicTypeHandler::SetFlags(&this->super_DynamicTypeHandler,' ');
  TraceFixedFieldsAfterSetIsProto
            (instance,&this->super_DynamicTypeHandler,&this->super_DynamicTypeHandler,oldType,
             (RecyclerWeakReference<Js::DynamicObject> *)setFixedFlags.instance);
  return;
}

Assistant:

void DictionaryTypeHandlerBase<T>::SetIsPrototype(DynamicObject* instance)
    {
        // Don't return if IsPrototypeFlag is set, because we may still need to do a type transition and
        // set fixed bits.  If this handler were to be shared, this instance may not be a prototype yet.
        // We might need to convert to a non-shared type handler and/or change type.
        if (!ChangeTypeOnProto() && !(GetIsOrMayBecomeShared() && IsolatePrototypes()))
        {
            SetFlags(IsPrototypeFlag);
            return;
        }

        // DictionaryTypeHandlers are never shared. If we allow sharing, we will have to handle this case
        // just like SimpleDictionaryTypeHandler.
        Assert(!GetIsOrMayBecomeShared());

#if ENABLE_FIXED_FIELDS
        Assert(!GetIsShared() || this->singletonInstance == nullptr);
        Assert(this->singletonInstance == nullptr || this->singletonInstance->Get() == instance);

        // Review (jedmiad): Why isn't this getting inlined?
        const auto setFixedFlags = [instance](const PropertyRecord* propertyRecord, DictionaryPropertyDescriptor<T>* const descriptor, bool hasNewType)
        {
            if (IsInternalPropertyId(propertyRecord->GetPropertyId()))
            {
                return;
            }
            if (!(descriptor->Attributes & PropertyDeleted))
            {
                // See PathTypeHandlerBase::ConvertToSimpleDictionaryType for rules governing fixed field bits during type
                // handler transitions.  In addition, we know that the current instance is not yet a prototype.

                Assert(descriptor->SanityCheckFixedBits());
                if (descriptor->GetIsInitialized())
                {
                    // Since DictionaryTypeHandlers are never shared, we can set fixed fields and clear used as fixed as long
                    // as we have changed the type.  Otherwise populated load field caches would still be valid and would need
                    // to be explicitly invalidated if the property value changes.
                    if (hasNewType)
                    {
                        T dataSlot = descriptor->template GetDataPropertyIndex<false>();
                        if (dataSlot != NoSlots)
                        {
                            Var value = instance->GetSlot(dataSlot);
                            // Because DictionaryTypeHandlers are never shared we should always have a property value if the handler
                            // says it's initialized.
                            Assert(value != nullptr);
                            descriptor->SetIsFixed(VarIs<JavascriptFunction>(value) ? ShouldFixMethodProperties() : (ShouldFixDataProperties() && CheckHeuristicsForFixedDataProps(instance, propertyRecord, value)));
                        }
                        else if (descriptor->GetIsAccessor())
                        {
                            Assert(descriptor->GetGetterPropertyIndex() != NoSlots && descriptor->GetSetterPropertyIndex() != NoSlots);
                            descriptor->SetIsFixed(ShouldFixAccessorProperties());
                        }

                        // Since we have a new type we can clear all used as fixed bits.  That's because any instance field loads
                        // will have been invalidated by the type transition, and there are no proto fields loads from this object
                        // because it is just now becoming a proto.
                        descriptor->SetUsedAsFixed(false);
                    }
                }
                else
                {
                    Assert(!descriptor->GetIsFixed() && !descriptor->GetUsedAsFixed());
                }
                Assert(descriptor->SanityCheckFixedBits());
            }
        };

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        DynamicType* oldType = instance->GetDynamicType();
        RecyclerWeakReference<DynamicObject>* oldSingletonInstance = GetSingletonInstance();
        TraceFixedFieldsBeforeSetIsProto(instance, this, oldType, oldSingletonInstance);
#endif
#endif

        bool hasNewType = false;
        if (ChangeTypeOnProto())
        {
            // Forcing a type transition allows us to fix all fields (even those that were previously marked as non-fixed).
            instance->ChangeType();
            Assert(!instance->HasSharedType());
            hasNewType = true;
        }

        // Currently there is no way to become the prototype if you are a stack instance
        Assert(!ThreadContext::IsOnStack(instance));
#if ENABLE_FIXED_FIELDS
        if (AreSingletonInstancesNeeded() && this->singletonInstance == nullptr)
        {
            this->singletonInstance = instance->CreateWeakReferenceToSelf();
        }

        // We don't want fixed properties on external objects.  See DynamicObject::ResetObject for more information.
        if (!instance->IsExternal())
        {
            // The propertyMap dictionary is guaranteed to have contiguous entries because we never remove entries from it.
            for (int i = 0; i < propertyMap->Count(); i++)
            {
                const PropertyRecord* propertyRecord = propertyMap->GetKeyAt(i);
                DictionaryPropertyDescriptor<T>* const descriptor = propertyMap->GetReferenceAt(i);
                setFixedFlags(propertyRecord, descriptor, hasNewType);
            }
        }
#endif

        SetFlags(IsPrototypeFlag);

#if ENABLE_FIXED_FIELDS
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        TraceFixedFieldsAfterSetIsProto(instance, this, this, oldType, oldSingletonInstance);
#endif
#endif
    }